

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O3

bool __thiscall groundupdb::HashedValue::operator==(HashedValue *this,HashedValue *other)

{
  byte *pbVar1;
  byte *pbVar2;
  byte *pbVar3;
  pointer pbVar4;
  bool bVar5;
  
  if ((this->m_hash == other->m_hash) && (this->m_length == other->m_length)) {
    pbVar1 = (this->m_data).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start;
    pbVar2 = (this->m_data).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pbVar4 = (other->m_data).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((long)pbVar2 - (long)pbVar1 ==
        (long)(other->m_data).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)pbVar4) {
      if (pbVar1 == pbVar2) {
        return true;
      }
      do {
        pbVar3 = pbVar1 + 1;
        bVar5 = *pbVar1 == *pbVar4;
        if (!bVar5) {
          return bVar5;
        }
        pbVar4 = pbVar4 + 1;
        pbVar1 = pbVar3;
      } while (pbVar3 != pbVar2);
      return bVar5;
    }
  }
  return false;
}

Assistant:

bool
HashedValue::operator==(const HashedValue& other) const
{
  if (m_hash != other.m_hash) {
    return false;
  }
  // compare hash first as generally it will be faster most often
  if (m_length != other.m_length) {
    return false;
  }
  // only do a data wise comparison if you must (highly, highly unlikely - requires hash collision)
  //return 0 == std::strcmp(m_data,other.m_data);
  return m_data == other.m_data;
}